

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::
newAdaptedPromise<void,kj::TimerImpl::TimerPromiseAdapter,kj::TimerImpl::Impl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
          (kj *this,Impl *adapterConstructorParams,
          Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
          *adapterConstructorParams_1)

{
  AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> *pAVar1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>,kj::TimerImpl::Impl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
            ((kj *)&local_30,adapterConstructorParams,adapterConstructorParams_1);
  pAVar1 = local_30.ptr;
  local_20.disposer = local_30.disposer;
  local_30.ptr = (AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> *)0x0;
  *(Disposer **)this = local_30.disposer;
  *(AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> **)(this + 8) = pAVar1;
  local_20.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_20);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_>::dispose
            (&local_30);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}